

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrDeserializeSceneFragmentMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  ostream *poVar1;
  ulong uVar2;
  string buffer_prefix;
  string buffersize_prefix;
  string buffer_array_prefix;
  ostringstream oss_buffer_array;
  ostringstream oss_bufferSize;
  ostringstream oss_buffer;
  _Alloc_hider in_stack_fffffffffffffae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  PointerToHexString<XrDeserializeSceneFragmentMSFT>
            ((XrDeserializeSceneFragmentMSFT *)in_stack_fffffffffffffae8._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,local_320);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&local_4f8,(string *)prefix);
  std::__cxx11::string::append((char *)&local_4f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  poVar1 = std::operator<<((ostream *)local_320,"0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_4f8,local_498);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffae8,(string *)prefix);
  std::__cxx11::string::append(&stack0xfffffffffffffae8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::operator<<((ostream *)local_498,(char *)value->buffer);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [15])"const uint8_t*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffae8,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  for (uVar2 = 0; uVar2 < value->bufferSize; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string((string *)&local_4b8,(string *)&stack0xfffffffffffffae8);
    std::__cxx11::string::append((char *)&local_4b8);
    std::__cxx11::to_string(local_1a8,(uint)uVar2);
    std::__cxx11::string::append((string *)&local_4b8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::append((char *)&local_4b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar1 = std::operator<<((ostream *)local_1a8,"0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::operator<<(poVar1,value->buffer[uVar2]);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[15],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [15])"const uint8_t*",&local_4b8,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffae8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::__cxx11::string::~string((string *)&local_4f8);
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrDeserializeSceneFragmentMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string buffersize_prefix = prefix;
        buffersize_prefix += "bufferSize";
        std::ostringstream oss_bufferSize;
        oss_bufferSize << "0x" << std::hex << (value->bufferSize);
        contents.emplace_back("uint32_t", buffersize_prefix, oss_bufferSize.str());
        std::string buffer_prefix = prefix;
        buffer_prefix += "buffer";
        std::ostringstream oss_buffer_array;
        oss_buffer_array << std::hex << (value->buffer);
        contents.emplace_back("const uint8_t*", buffer_prefix, oss_buffer_array.str());
        for (uint32_t value_buffer_inc = 0; value_buffer_inc < value->bufferSize; ++value_buffer_inc) {
            std::string buffer_array_prefix = buffer_prefix;
            buffer_array_prefix += "[";
            buffer_array_prefix += std::to_string(value_buffer_inc);
            buffer_array_prefix += "]";
            std::ostringstream oss_buffer;
            oss_buffer << "0x" << std::hex << (value->buffer[value_buffer_inc]);
            contents.emplace_back("const uint8_t*", buffer_array_prefix, oss_buffer.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}